

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PortSymbol::getNetTypes
          (PortSymbol *this,SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *ranges)

{
  Symbol *pSVar1;
  Type *this_00;
  NetTypeRange local_28;
  
  getType(this);
  if (this->internalExpr != (Expression *)0x0) {
    getNetRanges(this->internalExpr,ranges);
    return;
  }
  pSVar1 = this->internalSymbol;
  if ((pSVar1 != (Symbol *)0x0) && (pSVar1->kind == Net)) {
    local_28.netType = (NetType *)pSVar1[5].name._M_str;
    this_00 = getType(this);
    local_28.width = Type::getBitWidth(this_00);
    SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
    emplace_back<slang::ast::PortSymbol::NetTypeRange>(ranges,&local_28);
  }
  return;
}

Assistant:

void PortSymbol::getNetTypes(SmallVectorBase<NetTypeRange>& ranges) const {
    if (auto ie = getInternalExpr()) {
        getNetRanges(*ie, ranges);
    }
    else if (internalSymbol && internalSymbol->kind == SymbolKind::Net) {
        auto& nt = internalSymbol->as<NetSymbol>().netType;
        ranges.push_back({&nt, getType().getBitWidth()});
    }
}